

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_memory_model.cpp
# Opt level: O2

Status __thiscall spvtools::opt::UpgradeMemoryModel::Process(UpgradeMemoryModel *this)

{
  __uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
  this_00;
  bool bVar1;
  uint32_t uVar2;
  FeatureManager *pFVar3;
  Status SVar4;
  
  pFVar3 = IRContext::get_feature_mgr((this->super_Pass).context_);
  bVar1 = EnumSet<spv::Capability>::contains(&pFVar3->capabilities_,CapabilityCooperativeMatrixNV);
  SVar4 = SuccessWithoutChange;
  if (!bVar1) {
    this_00.
    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
         (((((this->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->memory_model_)._M_t
         .
         super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
    ;
    uVar2 = Instruction::GetSingleWordInOperand
                      ((Instruction *)
                       this_00.
                       super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                       .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,0);
    if (uVar2 == 0) {
      uVar2 = Instruction::GetSingleWordInOperand
                        ((Instruction *)
                         this_00.
                         super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                         .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,1)
      ;
      if (uVar2 == 1) {
        UpgradeMemoryModelInstruction(this);
        UpgradeInstructions(this);
        CleanupDecorations(this);
        UpgradeBarriers(this);
        UpgradeMemoryScope(this);
        SVar4 = SuccessWithChange;
      }
    }
  }
  return SVar4;
}

Assistant:

Pass::Status UpgradeMemoryModel::Process() {
  // TODO: This pass needs changes to support cooperative matrices.
  if (context()->get_feature_mgr()->HasCapability(
          spv::Capability::CooperativeMatrixNV)) {
    return Pass::Status::SuccessWithoutChange;
  }

  // Only update Logical GLSL450 to Logical VulkanKHR.
  Instruction* memory_model = get_module()->GetMemoryModel();
  if (memory_model->GetSingleWordInOperand(0u) !=
          uint32_t(spv::AddressingModel::Logical) ||
      memory_model->GetSingleWordInOperand(1u) !=
          uint32_t(spv::MemoryModel::GLSL450)) {
    return Pass::Status::SuccessWithoutChange;
  }

  UpgradeMemoryModelInstruction();
  UpgradeInstructions();
  CleanupDecorations();
  UpgradeBarriers();
  UpgradeMemoryScope();

  return Pass::Status::SuccessWithChange;
}